

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_set_cpsr(TCGContext_conflict1 *tcg_ctx,TCGv_i32 var,uint32_t mask)

{
  uintptr_t o_1;
  TCGv_i32 pTVar1;
  uintptr_t o;
  TCGTemp *local_28;
  TCGv_i32 local_20;
  TCGTemp *local_18;
  
  pTVar1 = tcg_const_i32_aarch64(tcg_ctx,mask);
  local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_20 = var + (long)tcg_ctx;
  local_18 = (TCGTemp *)(pTVar1 + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,helper_cpsr_write_aarch64,(TCGTemp *)0x0,3,&local_28);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_set_cpsr(TCGContext *tcg_ctx, TCGv_i32 var, uint32_t mask)
{
    TCGv_i32 tmp_mask = tcg_const_i32(tcg_ctx, mask);
    gen_helper_cpsr_write(tcg_ctx, tcg_ctx->cpu_env, var, tmp_mask);
    tcg_temp_free_i32(tcg_ctx, tmp_mask);
}